

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::GLMClassifier_DoubleArray::_InternalSerialize
          (GLMClassifier_DoubleArray *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  RepeatedField<double> *this_00;
  byte *pbVar3;
  LogMessage *other;
  double *data;
  void *data_00;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  GLMClassifier_DoubleArray *this_local;
  unsigned_long size;
  unsigned_long element_size;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  byte *local_48;
  uint local_40;
  int local_3c;
  EpsCopyOutputStream *local_38;
  byte *local_30;
  uint local_24;
  byte *local_20;
  byte *local_18;
  uint local_c;
  
  iVar2 = _internal_value_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  if (0 < iVar2) {
    this_00 = _internal_value(this);
    pbVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar2 = google::protobuf::RepeatedField<double>::size(this_00);
    local_3c = 1;
    local_40 = 2;
    local_81 = 0;
    local_48 = pbVar3;
    local_38 = stream;
    if (stream->end_ <= pbVar3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      local_81 = 1;
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_80,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(local_95,other);
    }
    if ((local_81 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_80);
    }
    local_24 = local_3c << 3 | local_40;
    local_30 = local_48;
    *local_48 = (byte)local_24;
    if (local_24 < 0x80) {
      local_20 = local_48 + 1;
    }
    else {
      *local_48 = *local_48 | 0x80;
      local_24 = local_24 >> 7;
      local_48[1] = (byte)local_24;
      if (local_24 < 0x80) {
        local_20 = local_48 + 2;
      }
      else {
        local_30 = local_48 + 2;
        do {
          local_30[-1] = local_30[-1] | 0x80;
          local_24 = local_24 >> 7;
          *local_30 = (byte)local_24;
          local_30 = local_30 + 1;
          local_20 = local_30;
        } while (0x7f < local_24);
      }
    }
    local_18 = local_20;
    for (local_c = iVar2 << 3; 0x7f < local_c; local_c = local_c >> 7) {
      *local_18 = (byte)local_c | 0x80;
      local_18 = local_18 + 1;
    }
    pbVar3 = local_18 + 1;
    *local_18 = (byte)local_c;
    local_18 = pbVar3;
    data = google::protobuf::RepeatedField<double>::data(this_00);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<8>
                             (stream,data,iVar2 << 3,pbVar3);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data_00 = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar2 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data_00,iVar2,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* GLMClassifier_DoubleArray::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.GLMClassifier.DoubleArray)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated double value = 1;
  if (this->_internal_value_size() > 0) {
    target = stream->WriteFixedPacked(1, _internal_value(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.GLMClassifier.DoubleArray)
  return target;
}